

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Descriptor.hpp
# Opt level: O0

void __thiscall
ArrayDescriptor::ArrayDescriptor
          (ArrayDescriptor *this,vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *array)

{
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> local_68;
  allocator<char> local_39;
  string local_38;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *local_18;
  vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *array_local;
  ArrayDescriptor *this_local;
  
  local_18 = array;
  array_local = (vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_> *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"",&local_39);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&local_68,array);
  TypeDescriptor::TypeDescriptor(&this->super_TypeDescriptor,ARRAY,0.0,&local_38,0.0,&local_68);
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::~vector(&local_68);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  (this->super_TypeDescriptor)._vptr_TypeDescriptor = (_func_int **)&PTR__ArrayDescriptor_00131d80;
  std::vector<TypeDescriptor_*,_std::allocator<TypeDescriptor_*>_>::vector(&this->_array,array);
  return;
}

Assistant:

explicit ArrayDescriptor(std::vector<TypeDescriptor*>array):  TypeDescriptor(ARRAY, 0, "",false, array), _array{array} {}